

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O0

void Dsd_TreePrint(FILE *pFile,Dsd_Manager_t *pDsdMan,char **pInputNames,char **pOutputNames,
                  int fShortNames,int Output)

{
  int local_40;
  int local_3c;
  int i;
  int SigCounter;
  Dsd_Node_t *pNode;
  int Output_local;
  int fShortNames_local;
  char **pOutputNames_local;
  char **pInputNames_local;
  Dsd_Manager_t *pDsdMan_local;
  FILE *pFile_local;
  
  local_3c = 1;
  pNode._4_4_ = fShortNames;
  _Output_local = pOutputNames;
  pOutputNames_local = pInputNames;
  pInputNames_local = (char **)pDsdMan;
  pDsdMan_local = (Dsd_Manager_t *)pFile;
  if (Output == -1) {
    pNode._0_4_ = 0xffffffff;
    for (local_40 = 0; local_40 < *(int *)((long)pInputNames_local + 0x14); local_40 = local_40 + 1)
    {
      _i = (Dsd_Node_t *)
           (*(ulong *)(pInputNames_local[5] + (long)local_40 * 8) & 0xfffffffffffffffe);
      Dsd_TreePrint_rec((FILE *)pDsdMan_local,_i,
                        (uint)(_i != *(Dsd_Node_t **)(pInputNames_local[5] + (long)local_40 * 8)),
                        pOutputNames_local,_Output_local[local_40],0,&local_3c,pNode._4_4_);
    }
  }
  else {
    pNode._0_4_ = Output;
    if ((Output < 0) || (pDsdMan->nRoots <= Output)) {
      __assert_fail("Output >= 0 && Output < pDsdMan->nRoots",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdTree.c"
                    ,0x292,"void Dsd_TreePrint(FILE *, Dsd_Manager_t *, char **, char **, int, int)"
                   );
    }
    _i = (Dsd_Node_t *)((ulong)pDsdMan->pRoots[Output] & 0xfffffffffffffffe);
    Dsd_TreePrint_rec(pFile,_i,(uint)(_i != pDsdMan->pRoots[Output]),pInputNames,
                      pOutputNames[Output],0,&local_3c,fShortNames);
  }
  return;
}

Assistant:

void Dsd_TreePrint( FILE * pFile, Dsd_Manager_t * pDsdMan, char * pInputNames[], char * pOutputNames[], int fShortNames, int Output )
{
    Dsd_Node_t * pNode;
    int SigCounter;
    int i;
    SigCounter = 1;

    if ( Output == -1 )
    {
        for ( i = 0; i < pDsdMan->nRoots; i++ )
        {
            pNode = Dsd_Regular( pDsdMan->pRoots[i] );
            Dsd_TreePrint_rec( pFile, pNode, (pNode != pDsdMan->pRoots[i]), pInputNames, pOutputNames[i], 0, &SigCounter, fShortNames );
        }
    }
    else
    {
        assert( Output >= 0 && Output < pDsdMan->nRoots );
        pNode = Dsd_Regular( pDsdMan->pRoots[Output] );
        Dsd_TreePrint_rec( pFile, pNode, (pNode != pDsdMan->pRoots[Output]), pInputNames, pOutputNames[Output], 0, &SigCounter, fShortNames );
    }
}